

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

void __thiscall IntElemBoundsImp<0,_0,_0>::wakeup(IntElemBoundsImp<0,_0,_0> *this,int i,int c)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  int64_t iVar7;
  Propagator *this_00;
  long v;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int64_t in_stack_ffffffffffffff98;
  Propagator *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffbc;
  Tint *in_stack_ffffffffffffffc0;
  
  uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
  if (((in_ESI != uVar3 + 2) || ((in_EDX & 8) == 0)) ||
     (iVar4 = BoolView::getVal((BoolView *)in_stack_ffffffffffffffa0), iVar4 != 0)) {
    uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
    if ((in_ESI == uVar3 + 1) && ((in_EDX & 8) != 0)) {
      Tchar::operator=((Tchar *)in_stack_ffffffffffffffc0,
                       (char)((uint)in_stack_ffffffffffffffbc >> 0x18));
      IntView<0>::getVal((IntView<0> *)in_stack_ffffffffffffffa0);
      Tint::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      *(undefined1 *)(in_RDI + 0x69) = 0;
      *(undefined1 *)(in_RDI + 0x68) = 0;
      Propagator::pushInQueue(in_stack_ffffffffffffffa0);
    }
    else {
      cVar1 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x58));
      if (cVar1 == '\0') {
        uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
        if ((int)in_ESI < (int)uVar3) {
          uVar3 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x5c));
          if (in_ESI == uVar3) {
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),in_ESI);
            iVar6 = IntView<0>::getMin((IntView<0> *)in_stack_ffffffffffffffa0);
            iVar7 = IntView<0>::getMin((IntView<0> *)in_stack_ffffffffffffffa0);
            if (iVar7 < iVar6) {
              *(undefined1 *)(in_RDI + 0x68) = 1;
            }
          }
          uVar3 = in_ESI;
          uVar5 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x60));
          if (uVar3 == uVar5) {
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),in_ESI);
            iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_ffffffffffffffa0);
            iVar7 = IntView<0>::getMax((IntView<0> *)in_stack_ffffffffffffffa0);
            if (iVar6 < iVar7) {
              *(undefined1 *)(in_RDI + 0x69) = 1;
            }
          }
          Propagator::pushInQueue(in_stack_ffffffffffffffa0);
        }
        else {
          uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
          if (in_ESI == uVar3 + 1) {
            this_00 = (Propagator *)(in_RDI + 0x38);
            Tint::operator_cast_to_int((Tint *)(in_RDI + 0x5c));
            bVar2 = IntView<0>::indomain((IntView<0> *)this_00,in_stack_ffffffffffffff98);
            if (!bVar2) {
              *(undefined1 *)(in_RDI + 0x68) = 1;
              Propagator::pushInQueue(this_00);
            }
            v = in_RDI + 0x38;
            Tint::operator_cast_to_int((Tint *)(in_RDI + 0x60));
            bVar2 = IntView<0>::indomain((IntView<0> *)this_00,v);
            if (!bVar2) {
              *(undefined1 *)(in_RDI + 0x69) = 1;
              Propagator::pushInQueue(this_00);
            }
          }
          else {
            Propagator::pushInQueue(in_stack_ffffffffffffffa0);
          }
        }
      }
      else {
        uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
        if ((in_ESI == uVar3) ||
           (uVar3 = Tint::operator_cast_to_int((Tint *)(in_RDI + 100)), in_ESI == uVar3)) {
          Propagator::pushInQueue(in_stack_ffffffffffffffa0);
        }
      }
    }
  }
  return;
}

Assistant:

void wakeup(int i, int c) override {
		if (i == static_cast<int>(a.size()) + 2 && ((c & EVENT_F) != 0)) {
			if (b.getVal() == 0) {
				return;
			}
		}
		if (i == static_cast<int>(a.size()) + 1 && ((c & EVENT_F) != 0)) {
			is_fixed = 1;
			fixed_index = static_cast<int>(x.getVal());
			no_min_support = no_max_support = false;
			pushInQueue();
		} else if (is_fixed != 0) {
			if (i == static_cast<int>(a.size()) || i == fixed_index) {
				pushInQueue();
			}
		} else {
			if (i < static_cast<int>(a.size())) {
				if (i == min_support && a[i].getMin() > y.getMin()) {
					no_min_support = true;
				}
				if (i == max_support && a[i].getMax() < y.getMax()) {
					no_max_support = true;
				}
				pushInQueue();
			} else if (i == static_cast<int>(a.size() + 1)) {
				if (!x.indomain(min_support)) {
					no_min_support = true;
					pushInQueue();
				}
				if (!x.indomain(max_support)) {
					no_max_support = true;
					pushInQueue();
				}
			} else {
				pushInQueue();
			}
		}
	}